

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86_avx512::forward_int8_x86
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined1 (*in_RCX) [64];
  long *in_RSI;
  undefined1 auVar2 [64];
  Mat tmp_2;
  Mat tmp_1;
  Mat tmp;
  int ret;
  int _nT;
  Mat top_blob_int32;
  bool prefer_winograd;
  int out_elempack_int32;
  int num_input;
  size_t out_elemsize;
  int out_elempack;
  bool use_int8_requantize;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  int channels;
  int h;
  int w;
  Mat bottom_blob_bordered;
  Option opt_q;
  Mat bottom_blob_int8;
  int elembits;
  Option *in_stack_fffffffffffff918;
  Mat *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff92c;
  Convolution *in_stack_fffffffffffff930;
  void **ppvVar3;
  undefined8 *puVar4;
  Option *in_stack_fffffffffffffa28;
  undefined2 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa32;
  undefined1 in_stack_fffffffffffffa33;
  undefined4 in_stack_fffffffffffffa34;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  Mat *in_stack_fffffffffffffa40;
  int local_55c;
  void *__ptr;
  int *piVar5;
  void *local_348;
  int *local_340;
  long local_338;
  undefined4 local_330;
  long *local_328;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  int local_310;
  long local_308;
  int local_2fc;
  int local_2d4;
  undefined1 *local_2d0;
  
  if ((int)in_RSI[3] == 0) {
    local_55c = 0;
  }
  else {
    local_55c = (int)((long)((ulong)(uint)((int)(in_RSI[2] << 3) >> 0x1f) << 0x20 |
                            in_RSI[2] << 3 & 0xffffffffU) / (long)(int)in_RSI[3]);
  }
  local_2fc = local_55c;
  local_348 = (void *)*in_RSI;
  local_340 = (int *)in_RSI[1];
  local_338 = in_RSI[2];
  local_330 = (undefined4)in_RSI[3];
  local_328 = (long *)in_RSI[4];
  local_320 = (undefined4)in_RSI[5];
  local_31c = *(undefined4 *)((long)in_RSI + 0x2c);
  local_318 = (undefined4)in_RSI[6];
  local_314 = *(undefined4 *)((long)in_RSI + 0x34);
  local_310 = (int)in_RSI[7];
  local_308 = in_RSI[8];
  if (local_340 != (int *)0x0) {
    LOCK();
    *local_340 = *local_340 + 1;
    UNLOCK();
  }
  if (local_55c != 8) {
    auVar2 = vmovdqu64_avx512f(*in_RCX);
    vmovdqu64_avx512f(auVar2);
    quantize_to_int8(in_stack_fffffffffffffa40,
                     (Mat *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                     (Mat *)CONCAT44(in_stack_fffffffffffffa34,
                                     CONCAT13(in_stack_fffffffffffffa33,
                                              CONCAT12(in_stack_fffffffffffffa32,
                                                       in_stack_fffffffffffffa30))),
                     in_stack_fffffffffffffa28);
    if (local_348 == (void *)0x0 || local_308 * local_310 == 0) {
      local_2d4 = -100;
      goto LAB_002d4c64;
    }
  }
  local_2d0 = &stack0xfffffffffffffc20;
  __ptr = (void *)0x0;
  piVar5 = (int *)0x0;
  Convolution::make_padding
            (in_stack_fffffffffffff930,
             (Mat *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
             in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  local_2d4 = -100;
  puVar4 = (undefined8 *)&stack0xfffffffffffffc20;
  if (piVar5 != (int *)0x0) {
    LOCK();
    iVar1 = *piVar5;
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if ((iVar1 == 1) && (__ptr != (void *)0x0)) {
      free(__ptr);
    }
  }
  *puVar4 = 0;
  puVar4[2] = 0;
  *(undefined4 *)(puVar4 + 3) = 0;
  *(undefined4 *)(puVar4 + 5) = 0;
  *(undefined4 *)((long)puVar4 + 0x2c) = 0;
  *(undefined4 *)(puVar4 + 6) = 0;
  *(undefined4 *)((long)puVar4 + 0x34) = 0;
  *(undefined4 *)(puVar4 + 7) = 0;
  puVar4[8] = 0;
  puVar4[1] = 0;
LAB_002d4c64:
  ppvVar3 = &local_348;
  if (local_340 != (int *)0x0) {
    LOCK();
    iVar1 = *local_340;
    *local_340 = *local_340 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_328 == (long *)0x0) {
        if (local_348 != (void *)0x0) {
          free(local_348);
        }
      }
      else {
        (**(code **)(*local_328 + 0x18))(local_328,local_348);
      }
    }
  }
  *ppvVar3 = (void *)0x0;
  ppvVar3[2] = (void *)0x0;
  *(undefined4 *)(ppvVar3 + 3) = 0;
  *(undefined4 *)(ppvVar3 + 5) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
  *(undefined4 *)(ppvVar3 + 6) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
  *(undefined4 *)(ppvVar3 + 7) = 0;
  ppvVar3[8] = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  return local_2d4;
}

Assistant:

int Convolution_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    //     NCNN_LOGE("Convolution_x86_avx512 input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
        {
#if __AVX512F__
            out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_x86 %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
        {
#if __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
        else
        {
#if __AVX512F__
            out_elempack_int32 = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

#if __SSE2__
    if (opt.use_packing_layout)
    {
        if ((opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1) || (!opt.use_sgemm_convolution))
        {
            // TODO implement winograd and packed int8 avx pack8 output
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
        }
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution && !weight_winograd43_data.empty())
            ret = conv3x3s1_winograd43_int8(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, _nT, opt);
        else
            ret = conv3x3s1_winograd23_int8(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, _nT, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        ret = convolution_im2col_gemm_int8(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
    }
    else
    {
        convolution_packed_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
    }
    if (ret != 0)
        return ret;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        // NCNN_LOGE("top_blob_int32  %d  %d", top_blob_int32.c, top_blob_int32.elempack);
        if (use_int8_requantize)
        {
            // TODO implement winograd and packed int8 pack1 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 1)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 1, opt);
                top_blob_int32 = tmp;
            }
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
        }
        else
        {
#if __AVX__
            // TODO implement winograd and packed int8 avx pack8 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
#endif // __AVX__
        }
    }
#endif

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}